

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3ExprUnmapAndDelete(Parse *pParse,Expr *p)

{
  Expr *p_local;
  Parse *pParse_local;
  
  if (p != (Expr *)0x0) {
    if (1 < pParse->eParseMode) {
      sqlite3RenameExprUnmap(pParse,p);
    }
    sqlite3ExprDeleteNN(pParse->db,p);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprUnmapAndDelete(Parse *pParse, Expr *p){
  if( p ){
    if( IN_RENAME_OBJECT ){
      sqlite3RenameExprUnmap(pParse, p);
    }
    sqlite3ExprDeleteNN(pParse->db, p);
  }
}